

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::RepeatedFieldHelper<9>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  int iVar1;
  RepeatedPtrFieldBase *x;
  void *ptr;
  int local_2c;
  int i;
  RepeatedPtrFieldBase *array;
  ArrayOutput *output_local;
  FieldMetadata *md_local;
  void *field_local;
  
  x = Get<google::protobuf::internal::RepeatedPtrFieldBase>(field);
  local_2c = 0;
  while( true ) {
    iVar1 = AccessorHelper::Size(x);
    if (iVar1 <= local_2c) break;
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    ptr = AccessorHelper::Get(x,local_2c);
    SerializeTo<9,google::protobuf::internal::ArrayOutput>(ptr,output);
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    const internal::RepeatedPtrFieldBase& array =
        Get<internal::RepeatedPtrFieldBase>(field);
    for (int i = 0; i < AccessorHelper::Size(array); i++) {
      WriteTagTo(md.tag, output);
      SerializeTo<WireFormatLite::TYPE_STRING>(AccessorHelper::Get(array, i),
                                               output);
    }
  }